

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

bigint<13> * __thiscall bigint<13>::sub<13,1>(bigint<13> *this,bigint<13> *x,bigint<1> *y)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  iVar1 = x->len;
  iVar4 = y->len;
  uVar2 = 0;
  if (0 < (long)iVar4) {
    bVar7 = true;
    uVar5 = 0;
    do {
      uVar6 = 0;
      if (bVar7) {
        uVar6 = (uint)y->digits[uVar2];
      }
      uVar6 = (x->digits[uVar2] | 0x10000) - (uVar5 + uVar6);
      this->digits[uVar2] = (digit)uVar6;
      uVar5 = uVar6 >> 0x10 ^ 1;
      uVar2 = uVar2 + 1;
      bVar7 = uVar2 < (ulong)(long)iVar4;
    } while ((bVar7) || (uVar6 < 0x10000));
  }
  iVar4 = iVar1 - (int)uVar2;
  if (this != x && (iVar4 != 0 && (int)uVar2 <= iVar1)) {
    memcpy(this->digits + (uVar2 & 0xffffffff),x->digits + (uVar2 & 0xffffffff),(long)iVar4 * 2);
    iVar1 = x->len;
  }
  this->len = iVar1;
  if (iVar1 != 0) {
    lVar3 = (long)iVar1 + 1;
    do {
      iVar1 = iVar1 + -1;
      if (this->digits[lVar3 + -2] != 0) {
        return this;
      }
      this->len = iVar1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 1);
  }
  return this;
}

Assistant:

bigint &sub(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        ASSERT(x >= y);
        dbldigit borrow = 0;
        int i;
        for(i = 0; i < y.len || borrow; i++)
        {
             borrow = (1<<BI_DIGIT_BITS) + (dbldigit)x.digits[i] - (i<y.len ? (dbldigit)y.digits[i] : 0) - borrow;
             digits[i] = (digit)borrow;
             borrow = (borrow>>BI_DIGIT_BITS)^1;
        }
        if(i < x.len && this != &x) memcpy(&digits[i], &x.digits[i], (x.len - i)*sizeof(digit));
        len = x.len;
        shrink();
        return *this;
    }